

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QAsn1Element>::emplace<QAsn1Element_const&>
          (QMovableArrayOps<QAsn1Element> *this,qsizetype i,QAsn1Element *args)

{
  QAsn1Element *pQVar1;
  quint8 qVar2;
  Data *pDVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  long lVar7;
  QAsn1Element *pQVar8;
  bool bVar9;
  
  pDVar3 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0010f46f:
    qVar2 = args->mType;
    pDVar4 = (args->mValue).d.d;
    pcVar5 = (args->mValue).d.ptr;
    qVar6 = (args->mValue).d.size;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar9 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size
            != 0;
    QArrayDataPointer<QAsn1Element>::detachAndGrow
              ((QArrayDataPointer<QAsn1Element> *)this,(uint)(i == 0 && bVar9),1,
               (QAsn1Element **)0x0,(QArrayDataPointer<QAsn1Element> *)0x0);
    pQVar8 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.ptr;
    if (i == 0 && bVar9) {
      pQVar8[-1].mType = qVar2;
      pQVar8[-1].mValue.d.d = pDVar4;
      pQVar8[-1].mValue.d.ptr = pcVar5;
      pQVar8[-1].mValue.d.size = qVar6;
      (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.ptr =
           pQVar8 + -1;
      i = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size;
      goto LAB_0010f532;
    }
    pQVar1 = pQVar8 + i;
    memmove(pQVar1 + 1,pQVar8 + i,
            ((this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size
            - i) * 0x20);
    pQVar1->mType = qVar2;
    (pQVar1->mValue).d.d = pDVar4;
    (pQVar1->mValue).d.ptr = pcVar5;
    (pQVar1->mValue).d.size = qVar6;
  }
  else {
    lVar7 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size;
    if ((lVar7 != i) ||
       (pQVar8 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.
                 ptr,
       (pDVar3->super_QArrayData).alloc ==
       ((long)((long)pQVar8 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
       i)) {
      if ((i == 0) &&
         (pQVar8 = (this->super_QGenericArrayOps<QAsn1Element>).
                   super_QArrayDataPointer<QAsn1Element>.ptr,
         (QAsn1Element *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) != pQVar8)) {
        pQVar8[-1].mType = args->mType;
        pDVar4 = (args->mValue).d.d;
        pQVar8[-1].mValue.d.d = pDVar4;
        pQVar8[-1].mValue.d.ptr = (args->mValue).d.ptr;
        pQVar8[-1].mValue.d.size = (args->mValue).d.size;
        if (pDVar4 != (Data *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQVar8 = (this->super_QGenericArrayOps<QAsn1Element>).
                   super_QArrayDataPointer<QAsn1Element>.ptr;
          lVar7 = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>
                  .size;
        }
        (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.ptr =
             pQVar8 + -1;
        i = lVar7;
        goto LAB_0010f532;
      }
      goto LAB_0010f46f;
    }
    pQVar8[i].mType = args->mType;
    pDVar4 = (args->mValue).d.d;
    pQVar8[i].mValue.d.d = pDVar4;
    pQVar8[i].mValue.d.ptr = (args->mValue).d.ptr;
    pQVar8[i].mValue.d.size = (args->mValue).d.size;
    if (pDVar4 == (Data *)0x0) goto LAB_0010f532;
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  i = (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size;
LAB_0010f532:
  (this->super_QGenericArrayOps<QAsn1Element>).super_QArrayDataPointer<QAsn1Element>.size = i + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }